

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O0

int __thiscall
jrtplib::RTPUDPv6Transmitter::WaitForIncomingData
          (RTPUDPv6Transmitter *this,RTPTime *delay,bool *dataavailable)

{
  int status;
  int idxAbort;
  int idxRTCP;
  int idxRTP;
  SocketType SStack_34;
  int8_t readflags [3];
  SocketType socks [3];
  SocketType abortSocket;
  bool *dataavailable_local;
  RTPTime *delay_local;
  RTPUDPv6Transmitter *this_local;
  
  if ((this->init & 1U) == 0) {
    this_local._4_4_ = -0x72;
  }
  else if ((this->created & 1U) == 0) {
    this_local._4_4_ = -0x71;
  }
  else if ((this->waitingfordata & 1U) == 0) {
    RTPAbortDescriptors::GetAbortSocket(this->m_pAbortDesc);
    idxRTP = this->rtpsock;
    SStack_34 = this->rtcpsock;
    memset((void *)((long)&idxRTCP + 1),0,3);
    this->waitingfordata = true;
    this_local._4_4_ = RTPSelect(&idxRTP,(int8_t *)((long)&idxRTCP + 1),3,(RTPTime)delay->m_t);
    if (this_local._4_4_ < 0) {
      this->waitingfordata = false;
    }
    else {
      this->waitingfordata = false;
      if ((this->created & 1U) == 0) {
        this_local._4_4_ = 0;
      }
      else {
        if (idxRTCP._3_1_ != '\0') {
          RTPAbortDescriptors::ReadSignallingByte(this->m_pAbortDesc);
        }
        if (dataavailable != (bool *)0x0) {
          if ((idxRTCP._1_1_ == '\0') && (idxRTCP._2_1_ == '\0')) {
            *dataavailable = false;
          }
          else {
            *dataavailable = true;
          }
        }
        this_local._4_4_ = 0;
      }
    }
  }
  else {
    this_local._4_4_ = -0x60;
  }
  return this_local._4_4_;
}

Assistant:

int RTPUDPv6Transmitter::WaitForIncomingData(const RTPTime &delay,bool *dataavailable)
{
	if (!init)
		return ERR_RTP_UDPV6TRANS_NOTINIT;
	
	MAINMUTEX_LOCK
		
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_NOTCREATED;
	}
	if (waitingfordata)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_ALREADYWAITING;
	}
	
	SocketType abortSocket = m_pAbortDesc->GetAbortSocket();
	SocketType socks[3] = { rtpsock, rtcpsock, abortSocket };
	int8_t readflags[3] = { 0, 0, 0 };
	const int idxRTP = 0;
	const int idxRTCP = 1;
	const int idxAbort = 2;

	waitingfordata = true;
	
	WAITMUTEX_LOCK
	MAINMUTEX_UNLOCK

	int status = RTPSelect(socks, readflags, 3, delay);
	if (status < 0)
	{
		MAINMUTEX_LOCK
		waitingfordata = false;
		MAINMUTEX_UNLOCK
		WAITMUTEX_UNLOCK
		return status;
	}
	
	MAINMUTEX_LOCK
	waitingfordata = false;
	if (!created) // destroy called
	{
		MAINMUTEX_UNLOCK;
		WAITMUTEX_UNLOCK
		return 0;
	}
		
	// if aborted, read from abort buffer
	if (readflags[idxAbort])
		m_pAbortDesc->ReadSignallingByte();
	
	if (dataavailable != 0)
	{
		if (readflags[idxRTP] || readflags[idxRTCP])
			*dataavailable = true;
		else
			*dataavailable = false;
	}	

	MAINMUTEX_UNLOCK
	WAITMUTEX_UNLOCK
	return 0;
}